

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::EndTryTable(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  
  PushLabel(this,TryTable,param_types,result_types);
  PushTypes(this,param_types);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::EndTryTable(const TypeVector& param_types,
                                const TypeVector& result_types) {
  PushLabel(LabelType::TryTable, param_types, result_types);
  PushTypes(param_types);
  return Result::Ok;
}